

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O1

Aig_Obj_t * Ssw_ObjFrame_(Ssw_Frm_t *p,Aig_Obj_t *pObj,int i)

{
  ulong uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  void **ppvVar5;
  size_t __size;
  int iVar6;
  int iVar7;
  int iVar8;
  
  pVVar3 = p->vAig2Frm;
  lVar4 = (long)i * (long)p->nObjs;
  uVar1 = lVar4 + pObj->Id;
  iVar7 = (int)uVar1;
  if (iVar7 < pVVar3->nSize) goto LAB_005dab07;
  lVar4 = lVar4 + pObj->Id + 1;
  iVar2 = pVVar3->nCap;
  iVar6 = iVar2 * 2;
  iVar8 = (int)lVar4;
  if (iVar7 < iVar6) {
    if (iVar2 < iVar6 && iVar2 <= iVar7) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((long)iVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(long)iVar2 << 4);
      }
      pVVar3->pArray = ppvVar5;
LAB_005daae0:
      pVVar3->nCap = iVar6;
    }
  }
  else if (iVar2 <= iVar7) {
    __size = lVar4 * 8;
    if (pVVar3->pArray == (void **)0x0) {
      ppvVar5 = (void **)malloc(__size);
    }
    else {
      ppvVar5 = (void **)realloc(pVVar3->pArray,__size);
    }
    pVVar3->pArray = ppvVar5;
    iVar6 = iVar8;
    goto LAB_005daae0;
  }
  lVar4 = (long)pVVar3->nSize;
  if (pVVar3->nSize <= iVar7) {
    do {
      pVVar3->pArray[lVar4] = (void *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar8 != lVar4);
  }
  pVVar3->nSize = iVar8;
LAB_005dab07:
  if ((-1 < iVar7) && (iVar7 < pVVar3->nSize)) {
    return (Aig_Obj_t *)pVVar3->pArray[uVar1 & 0xffffffff];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline Aig_Obj_t * Ssw_ObjFrame_( Ssw_Frm_t * p, Aig_Obj_t * pObj, int i )                       { return (Aig_Obj_t *)Vec_PtrGetEntry( p->vAig2Frm, p->nObjs*i+pObj->Id );     }